

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.hpp
# Opt level: O0

error_code __thiscall
asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>::
set_verify_callback<std::_Bind<bool(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::_Placeholder<1>,std::_Placeholder<2>))(bool,asio::ssl::verify_context&)>>
          (stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&> *this,
          _Bind<bool_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(bool,_asio::ssl::verify_context_&)>
          *callback,error_code *ec)

{
  verify_callback<std::_Bind<bool_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(bool,_asio::ssl::verify_context_&)>_>
  *this_00;
  ulong *in_RDX;
  _Bind<bool_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(bool,_asio::ssl::verify_context_&)>
  *in_RSI;
  error_code eVar1;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  verify_callback_base *in_stack_ffffffffffffffa0;
  engine *in_stack_ffffffffffffffa8;
  
  this_00 = (verify_callback<std::_Bind<bool_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(bool,_asio::ssl::verify_context_&)>_>
             *)operator_new(0x20);
  detail::
  verify_callback<std::_Bind<bool_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(bool,_asio::ssl::verify_context_&)>_>
  ::verify_callback(this_00,in_RSI);
  detail::engine::set_verify_callback
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             (error_code *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  eVar1._0_8_ = *in_RDX & 0xffffffff;
  eVar1._M_cat = (error_category *)in_RDX[1];
  return eVar1;
}

Assistant:

ASIO_SYNC_OP_VOID set_verify_callback(VerifyCallback callback,
      asio::error_code& ec)
  {
    core_.engine_.set_verify_callback(
        new detail::verify_callback<VerifyCallback>(callback), ec);
    ASIO_SYNC_OP_VOID_RETURN(ec);
  }